

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  GLFWbool GVar4;
  char *__s1;
  uintptr_t *in_RSI;
  _GLFWfbconfig *in_RDI;
  XVisualInfo *vi;
  _GLFWfbconfig *u;
  GLXFBConfig n;
  int i;
  GLFWbool trustWindowBit;
  char *vendor;
  int usableCount;
  int nativeCount;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  GLXFBConfig *nativeConfigs;
  int in_stack_ffffffffffffff9c;
  XVisualInfo *in_stack_ffffffffffffffa0;
  _GLFWfbconfig *visual;
  size_t in_stack_ffffffffffffffb0;
  GLXFBConfig p_Var5;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  uint local_38;
  int local_34;
  _GLFWfbconfig *local_30;
  _GLFWfbconfig *local_28;
  GLXFBConfig *local_20;
  uintptr_t *local_18;
  _GLFWfbconfig *local_10;
  uint local_4;
  
  iVar6 = 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,"Chromium"), iVar1 == 0)) {
    iVar6 = 0;
  }
  local_20 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_34);
  if ((local_20 == (GLXFBConfig *)0x0) || (local_34 == 0)) {
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
    local_4 = 0;
  }
  else {
    local_28 = (_GLFWfbconfig *)
               _glfw_calloc(CONCAT44(iVar6,in_stack_ffffffffffffffb8),in_stack_ffffffffffffffb0);
    local_38 = 0;
    for (iVar1 = 0; iVar1 < local_34; iVar1 = iVar1 + 1) {
      p_Var5 = local_20[iVar1];
      visual = local_28 + (int)local_38;
      uVar2 = getGLXFBConfigAttrib((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
      ;
      if (((uVar2 & 1) != 0) &&
         (((uVar2 = getGLXFBConfigAttrib
                              ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
           (uVar2 & 1) != 0 || (iVar6 == 0)) &&
          (iVar3 = getGLXFBConfigAttrib
                             ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c),
          iVar3 == local_10->doublebuffer)))) {
        if ((local_10->transparent != 0) &&
           (in_stack_ffffffffffffffa0 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,p_Var5)
           , in_stack_ffffffffffffffa0 != (XVisualInfo *)0x0)) {
          GVar4 = _glfwIsVisualTransparentX11((Visual *)visual);
          visual->transparent = GVar4;
          (*_glfw.x11.xlib.Free)(in_stack_ffffffffffffffa0);
        }
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->redBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->greenBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->blueBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->alphaBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->depthBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->stencilBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->accumRedBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->accumGreenBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->accumBlueBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->accumAlphaBits = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        visual->auxBuffers = iVar3;
        iVar3 = getGLXFBConfigAttrib
                          ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        if (iVar3 != 0) {
          visual->stereo = 1;
        }
        if (_glfw.glx.ARB_multisample != 0) {
          iVar3 = getGLXFBConfigAttrib
                            ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          visual->samples = iVar3;
        }
        if ((_glfw.glx.ARB_framebuffer_sRGB != 0) || (_glfw.glx.EXT_framebuffer_sRGB != 0)) {
          iVar3 = getGLXFBConfigAttrib
                            ((GLXFBConfig)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          visual->sRGB = iVar3;
        }
        visual->handle = (uintptr_t)p_Var5;
        local_38 = local_38 + 1;
      }
    }
    local_30 = _glfwChooseFBConfig(local_10,local_28,local_38);
    if (local_30 != (_GLFWfbconfig *)0x0) {
      *local_18 = local_30->handle;
    }
    (*_glfw.x11.xlib.Free)(local_20);
    _glfw_free((void *)0xb06508);
    local_4 = (uint)(local_30 != (_GLFWfbconfig *)0x0);
  }
  return local_4;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = _glfw_calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (int i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER) != desired->doublebuffer)
            continue;

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    _glfw_free(usableConfigs);

    return closest != NULL;
}